

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

double __thiscall ON_Line::MaximumDistanceTo(ON_Line *this,ON_Line *L)

{
  double dVar1;
  double local_38;
  double b;
  double a;
  ON_Line *L_local;
  ON_Line *this_local;
  
  local_38 = MaximumDistanceTo(this,&L->from);
  dVar1 = MaximumDistanceTo(this,&L->to);
  if (local_38 < dVar1) {
    local_38 = dVar1;
  }
  return local_38;
}

Assistant:

double ON_Line::MaximumDistanceTo( const ON_Line& L ) const
{
  double a, b;
  a = MaximumDistanceTo(L.from);
  b = MaximumDistanceTo(L.to);
  return ((a<b)?b:a);
}